

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O3

ppcmas_tlb_t * booke206_cur_tlb(CPUPPCState_conflict2 *env)

{
  int iVar1;
  byte bVar2;
  char cVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t tlbncfg;
  uint uVar7;
  uint uVar8;
  
  uVar6 = (uint)env->spr[0x270];
  uVar5 = uVar6 >> 0x1c & 3;
  uVar4 = env->spr[(ulong)uVar5 + 0x2b0];
  if (((uVar6 >> 0xe & 1) != 0) && ((uVar4 & 0x2000) != 0)) {
    cpu_abort_ppc64((CPUState *)&env[-1].spr_cb[0x1bf].oea_write,"we don\'t support HES yet\n");
  }
  uVar8 = (uint)uVar4 >> 0x18;
  cVar3 = '\0';
  bVar2 = 0x20;
  if (uVar8 != 0) {
    iVar1 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> iVar1 & 1) == 0; iVar1 = iVar1 + 1) {
      }
    }
    bVar2 = (byte)iVar1;
  }
  uVar7 = (uint)uVar4 & 0xfff;
  if ((uVar4 & 0xfff) != 0) {
    iVar1 = 0;
    if ((uVar4 & 0xfff) != 0) {
      for (; (uVar7 >> iVar1 & 1) == 0; iVar1 = iVar1 + 1) {
      }
    }
    cVar3 = (char)iVar1;
  }
  uVar6 = ((uint)((ulong)(long)(int)env->spr[0x272] >> 0xc) & ~(-1 << (cVar3 - bVar2 & 0x1f))) <<
          (bVar2 & 0x3f) | uVar6 >> 0x10 & 0xfff & uVar8 + 0xfff;
  if ((int)uVar6 < (int)uVar7) {
    if (uVar5 != 0) {
      uVar4 = 0;
      do {
        uVar6 = uVar6 + ((uint)env->spr[uVar4 + 0x2b0] & 0xfff);
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
    return (ppcmas_tlb_t *)((env->tlb).tlb6 + (int)uVar6);
  }
  return (ppcmas_tlb_t *)0x0;
}

Assistant:

static ppcmas_tlb_t *booke206_cur_tlb(CPUPPCState *env)
{
    uint32_t tlbncfg = 0;
    int esel = (env->spr[SPR_BOOKE_MAS0] & MAS0_ESEL_MASK) >> MAS0_ESEL_SHIFT;
    int ea = (env->spr[SPR_BOOKE_MAS2] & MAS2_EPN_MASK);
    int tlb;

    tlb = (env->spr[SPR_BOOKE_MAS0] & MAS0_TLBSEL_MASK) >> MAS0_TLBSEL_SHIFT;
    tlbncfg = env->spr[SPR_BOOKE_TLB0CFG + tlb];

    if ((tlbncfg & TLBnCFG_HES) && (env->spr[SPR_BOOKE_MAS0] & MAS0_HES)) {
        cpu_abort(env_cpu(env), "we don't support HES yet\n");
    }

    return booke206_get_tlbm(env, tlb, ea, esel);
}